

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sweep.cc
# Opt level: O3

void __thiscall
p2t::Sweep::FillLeftAboveEdgeEvent(Sweep *this,SweepContext *tcx,Edge *edge,Node *node)

{
  Point *pPVar1;
  Node *pNVar2;
  Node *pNVar3;
  Point *pPVar4;
  double dVar5;
  double dVar6;
  
  pNVar2 = node->prev;
  pPVar4 = pNVar2->point;
  dVar6 = pPVar4->x;
  pPVar1 = edge->p;
  dVar5 = pPVar1->x;
  if (dVar5 < dVar6) {
    do {
      dVar6 = (edge->q->x - dVar5) * (pPVar4->y - pPVar1->y) -
              (dVar6 - dVar5) * (edge->q->y - pPVar1->y);
      pNVar3 = pNVar2;
      if ((1e-12 <= ABS(dVar6)) && (dVar6 <= 0.0)) {
        FillLeftBelowEdgeEvent(this,tcx,edge,node);
        pPVar1 = edge->p;
        dVar5 = pPVar1->x;
        pNVar3 = node;
      }
      pNVar2 = pNVar3->prev;
      pPVar4 = pNVar2->point;
      dVar6 = pPVar4->x;
      node = pNVar3;
    } while (dVar5 < dVar6);
  }
  return;
}

Assistant:

void Sweep::FillLeftAboveEdgeEvent(SweepContext& tcx, Edge* edge, Node* node)
{
  while (node->prev->point->x > edge->p->x) {
    // Check if next node is below the edge
    if (Orient2d(*edge->q, *node->prev->point, *edge->p) == CW) {
      FillLeftBelowEdgeEvent(tcx, edge, *node);
    } else {
      node = node->prev;
    }
  }
}